

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall pixels::fillRandom(pixels *this)

{
  unsigned_short uVar1;
  undefined2 uVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Rand48 rand;
  ushort local_36 [3];
  
  iVar9 = this->_h;
  if (0 < iVar9) {
    iVar3 = this->_w;
    iVar6 = 0;
    do {
      if (0 < iVar3) {
        iVar9 = 0;
        do {
          lVar7 = (long)(this->_stride_x * iVar6 + iVar9);
          uVar4 = Imath_3_2::nrand48(local_36);
          (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] = uVar4;
          uVar1 = Imath_3_2::nrand48(local_36);
          (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] = uVar1;
          lVar8 = 0x58;
          do {
            uVar2 = Imath_3_2::nrand48(local_36);
            *(undefined2 *)(*(long *)((long)this->rgba + lVar8 + -0x58) + lVar7 * 2) = uVar2;
            lVar8 = lVar8 + 0x18;
          } while (lVar8 != 0xb8);
          fVar5 = (float)Imath_3_2::nrand48(local_36);
          (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] = fVar5;
          iVar9 = iVar9 + 1;
          iVar3 = this->_w;
        } while (iVar9 < iVar3);
        iVar9 = this->_h;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar9);
  }
  return;
}

Assistant:

inline int
shiftAndRound (int x, int shift)
{
    x <<= 1;
    int a = (1 << shift) - 1;
    shift += 1;
    int b = (x >> shift) & 1;
    return (x + a + b) >> shift;
}